

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

int expandvals(char *cmdp,char *valp,char *bp)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  vhead vVar9;
  undefined1 local_1c8 [8];
  char contbuf [128];
  char varbuf [128];
  char argbuf [128];
  char *errstr;
  
  pcVar6 = skipwhite(cmdp);
  pcVar8 = varbuf + 0x78;
  uVar7 = strlcpy(pcVar8,pcVar6,0x80);
  if (uVar7 < 0x80) {
    bVar3 = false;
    bVar4 = false;
    bVar2 = false;
    pcVar6 = pcVar8;
    while( true ) {
      iVar5 = 1;
      cVar1 = *pcVar8;
      if (cVar1 == '\0') break;
      if (pcVar8[1] == '\0') {
        bVar4 = true;
      }
      if (cVar1 != ' ') {
        if (cVar1 == '\"') {
          bVar2 = !bVar2;
        }
        if (bVar3) {
          pcVar6 = pcVar8;
        }
        bVar3 = false;
      }
      if (!bVar3 && (bVar4 || cVar1 == ' ' && !bVar2)) {
        if (cVar1 == ' ') {
          *pcVar8 = '\0';
        }
        contbuf[0x78] = '\0';
        local_1c8[0] = 0;
        iVar5 = doregex("[\"]+.*[\"]+",pcVar6);
        if (iVar5 == 0) {
          if (varhead.slh_first != (varentry *)0x0) {
            for (vVar9 = varhead; vVar9.slh_first != (varentry *)0x0;
                vVar9.slh_first = ((vVar9.slh_first)->entry).sle_next) {
              iVar5 = strcmp(pcVar6,(vVar9.slh_first)->v_name);
              if (iVar5 == 0) {
                pcVar6 = contbuf + 0x78;
                strlcpy(pcVar6,(vVar9.slh_first)->v_buf,0x80);
                strlcat(pcVar6," ",0x80);
                *pcVar8 = ' ';
                strlcpy(local_1c8,pcVar8 + 1,0x80);
                strlcat(pcVar6,local_1c8,0x80);
                varbuf[0x78] = ' ';
                varbuf[0x79] = '\0';
                pcVar8 = varbuf + 0x78;
                strlcat(pcVar8,pcVar6,0x80);
                bVar4 = false;
                bVar3 = true;
                pcVar6 = pcVar8;
                goto LAB_0011fcd4;
              }
            }
          }
          strtonum(pcVar6,0,0x7fffffff,argbuf + 0x78);
          if (argbuf._120_8_ != 0) {
            iVar5 = dobeep_msgs("Var not found:",pcVar6);
            return iVar5;
          }
        }
        if (((*valp != '\0') && (uVar7 = strlcat(valp," ",0x80), 0x7f < uVar7)) ||
           (uVar7 = strlcat(valp,pcVar6,0x80), 0x7f < uVar7)) {
          pcVar8 = "strlcat error";
          goto LAB_0011fd6d;
        }
        if (bVar4) {
          return 1;
        }
        *pcVar8 = ' ';
        bVar4 = false;
        bVar3 = true;
      }
LAB_0011fcd4:
      pcVar8 = pcVar8 + 1;
    }
  }
  else {
    pcVar8 = "strlcpy error";
LAB_0011fd6d:
    iVar5 = dobeep_msg(pcVar8);
  }
  return iVar5;
}

Assistant:

static int
expandvals(char *cmdp, char *valp, char *bp)
{
	char	 argbuf[BUFSIZE];
	char	 contbuf[BUFSIZE], varbuf[BUFSIZE];
	char	*argp, *endp, *p, *v, *s = " ";
	char	*regs;
	int	 spc, cnt;
	int	 sizof, fin, inquote;

	/* now find the first argument */
	p = skipwhite(valp);

	if (strlcpy(argbuf, p, sizeof(argbuf)) >= sizeof(argbuf))
		return (dobeep_msg("strlcpy error"));
	argp = argbuf;
	spc = 1; /* initially fake a space so we find first argument */
	fin = inquote = cnt = spc = 0;

	for (p = argbuf; *p != '\0'; p++) {
		if (*(p + 1) == '\0')
			fin = 1;

		if (*p != ' ') {
			if (*p == '"') {
				if (inquote == 1)
					inquote = 0;
				else
					inquote = 1;
			}
			if (spc == 1)
				argp = p;
			spc = 0;
		}
		if ((*p == ' ' && inquote == 0) || fin) {
			if (spc == 1)
				continue;
			/* terminate arg string */
			if (*p == ' ') {
				*p = '\0';
			}
			endp = p + 1;
			varbuf[0] = '\0';
			contbuf[0] = '\0';
			sizof = sizeof(varbuf);
			v = varbuf;
			regs = "[\"]+.*[\"]+";
       			if (doregex(regs, argp))
				;			/* found quotes */
			else if (isvar(&argp, &v, sizof)) {

				(void)(strlcat(varbuf, " ",
                                    sizof) >= sizof);

				*p = ' ';
				(void)(strlcpy(contbuf, endp,
				    sizeof(contbuf)) >= sizeof(contbuf));

				(void)(strlcat(varbuf, contbuf,
				    sizof) >= sizof);

				argbuf[0] = ' ';
				argbuf[1] = '\0';
				(void)(strlcat(argbuf, varbuf,
				    sizof) >= sizof);

				p = argp = argbuf;
				spc = 1;
				fin = 0;
				continue;
			} else {
				const char *errstr;

				strtonum(argp, 0, INT_MAX, &errstr);
				if (errstr != NULL)
					return (dobeep_msgs("Var not found:",
					    argp));
			}
#ifdef  MGLOG
        mglog_misc("x|%s|%p|%d|\n", bp, defnam, BUFSIZE);
#endif
			if (*bp != '\0') {
				if (strlcat(bp, s, BUFSIZE) >= BUFSIZE)
					return (dobeep_msg("strlcat error"));
			}
			if (strlcat(bp, argp, BUFSIZE) >= BUFSIZE) {
				return (dobeep_msg("strlcat error"));
			}
/*			v1->v_count++;*/

			if (fin)
				break;

			*p = ' ';		/* unterminate arg string */
			spc = 1;
		}
	}
	return (TRUE);
}